

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

QStringList *
QtPrivate::QStringList_filter
          (QStringList *__return_storage_ptr__,QStringList *that,QRegularExpression *re)

{
  bool bVar1;
  long lVar2;
  QString *str;
  QString *this;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  this = (that->d).ptr;
  for (lVar2 = (that->d).size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    bVar1 = QString::contains(this,re,(QRegularExpressionMatch *)0x0);
    if (bVar1) {
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,this);
    }
    this = this + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, const QRegularExpression &re)
{
    QStringList res;
    for (const auto &str : *that) {
        if (str.contains(re))
            res.append(str);
    }
    return res;
}